

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

bool libtorrent::aux::verify_encoding(string *target)

{
  bool bVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  char *extraout_RDX;
  string_view str;
  undefined1 auVar4 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  size_type local_a8;
  unsigned_long local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  type_conflict2 *local_88;
  type_conflict2 *len;
  type_conflict2 *codepoint;
  size_t sStack_70;
  pair<int,_int> local_60;
  undefined1 auStack_58 [8];
  string_view ptr;
  bool valid_encoding;
  undefined1 local_38 [8];
  string tmp_path;
  string *target_local;
  
  tmp_path.field_2._8_8_ = target;
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::__cxx11::string::string((string *)local_38);
    ::std::__cxx11::string::size();
    ::std::__cxx11::string::reserve((ulong)local_38);
    ptr._M_str._3_1_ = 1;
    auVar4 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)tmp_path.field_2._8_8_);
    while( true ) {
      ptr._M_len = auVar4._8_8_;
      auStack_58 = auVar4._0_8_;
      bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      codepoint = (type_conflict2 *)auStack_58;
      sStack_70 = ptr._M_len;
      str._M_str = extraout_RDX;
      str._M_len = ptr._M_len;
      local_60 = parse_utf8_codepoint((aux *)auStack_58,str);
      len = ::std::get<0ul,int,int>(&local_60);
      local_88 = ::std::get<1ul,int,int>(&local_60);
      if (*len == -1) {
        *len = 0x5f;
        ptr._M_str._3_1_ = 0;
      }
      local_a0 = (unsigned_long)*local_88;
      local_a8 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58);
      puVar3 = ::std::min<unsigned_long>(&local_a0,&local_a8);
      bVar5 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_58,*puVar3,
                         0xffffffffffffffff);
      ptr._M_len = (size_t)bVar5._M_str;
      auStack_58 = (undefined1  [8])bVar5._M_len;
      local_98 = bVar5;
      append_utf8_codepoint((string *)local_38,*len);
      auVar4._8_8_ = ptr._M_len;
      auVar4._0_8_ = auStack_58;
    }
    if ((ptr._M_str._3_1_ & 1) == 0) {
      ::std::__cxx11::string::operator=((string *)tmp_path.field_2._8_8_,(string *)local_38);
    }
    target_local._7_1_ = (bool)(ptr._M_str._3_1_ & 1);
    ::std::__cxx11::string::~string((string *)local_38);
  }
  else {
    target_local._7_1_ = true;
  }
  return target_local._7_1_;
}

Assistant:

bool verify_encoding(std::string& target)
	{
		if (target.empty()) return true;

		std::string tmp_path;
		tmp_path.reserve(target.size()+5);
		bool valid_encoding = true;

		string_view ptr = target;
		while (!ptr.empty())
		{
			// decode a single utf-8 character
			auto [codepoint, len] = parse_utf8_codepoint(ptr);

			// this was the last character, and nothing was
			// written to the destination buffer (i.e. the source character was
			// truncated)
			if (codepoint == -1)
			{
				codepoint = '_';
				valid_encoding = false;
			}

			ptr = ptr.substr(std::min(std::size_t(len), ptr.size()));

			// encode codepoint into utf-8
			append_utf8_codepoint(tmp_path, codepoint);
		}

		// the encoding was not valid utf-8
		// save the original encoding and replace the
		// commonly used path with the correctly
		// encoded string
		if (!valid_encoding) target = tmp_path;
		return valid_encoding;
	}